

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<signed_char,_duckdb::ModeStandard<signed_char>_>::ModeRm
          (ModeState<signed_char,_duckdb::ModeStandard<signed_char>_> *this,idx_t frame)

{
  ColumnDataScanState *pCVar1;
  char *pcVar2;
  size_t sVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  
  pCVar1 = this->scan;
  if ((pCVar1->next_row_index <= frame) || (uVar5 = pCVar1->current_row_index, frame < uVar5)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)frame,(DataChunk *)pCVar1);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(char **)(pvVar4 + 0x20);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = (ValidityMask *)(pvVar4 + 0x28);
    uVar5 = this->scan->current_row_index;
  }
  pcVar2 = this->data;
  pmVar6 = std::__detail::
           _Map_base<signed_char,_std::pair<const_signed_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<signed_char,_std::pair<const_signed_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_signed_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,pcVar2 + (uint)((int)frame - (int)uVar5));
  sVar3 = pmVar6->count;
  this->nonzero = this->nonzero - (ulong)(sVar3 == 1);
  pmVar6->count = sVar3 - 1;
  if ((this->count == sVar3) && (pcVar2[(uint)((int)frame - (int)uVar5)] == *this->mode)) {
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}